

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

bool jsonip::parser::
     star_<jsonip::parser::seq_<jsonip::grammar::spaces_,jsonip::parser::comma,jsonip::grammar::spaces_,jsonip::grammar::member_,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>>>
     ::match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
               (ReaderState<jsonip::semantic_state,_jsonip::parser::Reader> *state)

{
  bool bVar1;
  bool local_11;
  ReaderState<jsonip::semantic_state,_jsonip::parser::Reader> *state_local;
  
  do {
    bVar1 = seq_<jsonip::grammar::spaces_,jsonip::parser::comma,jsonip::grammar::spaces_,jsonip::grammar::member_,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>>
            ::match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
                      (state);
    local_11 = false;
    if (bVar1) {
      bVar1 = seq_<jsonip::grammar::spaces_,jsonip::parser::comma,jsonip::grammar::spaces_,jsonip::grammar::member_,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>>
              ::match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
                        (state);
      local_11 = false;
      if (bVar1) {
        bVar1 = seq_<jsonip::grammar::spaces_,jsonip::parser::comma,jsonip::grammar::spaces_,jsonip::grammar::member_,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>>
                ::match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
                          (state);
        local_11 = false;
        if (bVar1) {
          bVar1 = seq_<jsonip::grammar::spaces_,jsonip::parser::comma,jsonip::grammar::spaces_,jsonip::grammar::member_,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>>
                  ::
                  match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
                            (state);
          local_11 = false;
          if (bVar1) {
            bVar1 = seq_<jsonip::grammar::spaces_,jsonip::parser::comma,jsonip::grammar::spaces_,jsonip::grammar::member_,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>>
                    ::
                    match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
                              (state);
            local_11 = false;
            if (bVar1) {
              bVar1 = seq_<jsonip::grammar::spaces_,jsonip::parser::comma,jsonip::grammar::spaces_,jsonip::grammar::member_,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>>
                      ::
                      match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
                                (state);
              local_11 = false;
              if (bVar1) {
                bVar1 = seq_<jsonip::grammar::spaces_,jsonip::parser::comma,jsonip::grammar::spaces_,jsonip::grammar::member_,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>>
                        ::
                        match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
                                  (state);
                local_11 = false;
                if (bVar1) {
                  bVar1 = seq_<jsonip::grammar::spaces_,jsonip::parser::comma,jsonip::grammar::spaces_,jsonip::grammar::member_,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>>
                          ::
                          match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
                                    (state);
                  local_11 = false;
                  if (bVar1) {
                    bVar1 = seq_<jsonip::grammar::spaces_,jsonip::parser::comma,jsonip::grammar::spaces_,jsonip::grammar::member_,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>>
                            ::
                            match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
                                      (state);
                    local_11 = false;
                    if (bVar1) {
                      local_11 = seq_<jsonip::grammar::spaces_,jsonip::parser::comma,jsonip::grammar::spaces_,jsonip::grammar::member_,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>>
                                 ::
                                 match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
                                           (state);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  } while (local_11 != false);
  return true;
}

Assistant:

static inline bool match(S& state)
        {
            while (C0::match(state) && C0::match(state) && C0::match(state) &&
                   C0::match(state) && C0::match(state) && C0::match(state) &&
                   C0::match(state) && C0::match(state) && C0::match(state) &&
                   C0::match(state))
                ;
            return true;
        }